

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

string * __thiscall
testing::internal::String::FormatHexUInt32_abi_cxx11_
          (string *__return_storage_ptr__,String *this,uint32_t value)

{
  uint *puVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190 [3];
  uint auStack_178 [22];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18)) & 0xffffffb5 | 8;
  puVar1 = (uint *)((long)auStack_178 + *(long *)(local_190[0] + -0x18));
  *puVar1 = *puVar1 | 0x4000;
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string String::FormatHexUInt32(uint32_t value) {
  std::stringstream ss;
  ss << std::hex << std::uppercase << value;
  return ss.str();
}